

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_refs_mark_task_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_refs_mark_task *t)

{
  MTBDD **arg_1;
  MTBDD *arg_1_00;
  mtbdd_refs_task_t arg_1_01;
  long in_FS_OFFSET;
  
  arg_1 = (MTBDD **)**(undefined8 **)(in_FS_OFFSET + -0x18);
  mtbdd_refs_mark_p_par_SPAWN
            (w,__dq_head,arg_1,(*(undefined8 **)(in_FS_OFFSET + -0x18))[2] - (long)arg_1 >> 3);
  arg_1_00 = *(MTBDD **)(*(long *)(in_FS_OFFSET + -0x18) + 0x18);
  mtbdd_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,arg_1_00,
             *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28) - (long)arg_1_00 >> 3);
  arg_1_01 = *(mtbdd_refs_task_t *)(*(long *)(in_FS_OFFSET + -0x18) + 0x30);
  mtbdd_refs_mark_s_par_CALL
            (w,__dq_head + 2,arg_1_01,
             *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x40) - (long)arg_1_01 >> 4);
  mtbdd_refs_mark_r_par_SYNC(w,__dq_head + 1);
  mtbdd_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(mtbdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    SPAWN(mtbdd_refs_mark_p_par, mtbdd_refs_key->pbegin, mtbdd_refs_key->pcur-mtbdd_refs_key->pbegin);
    SPAWN(mtbdd_refs_mark_r_par, mtbdd_refs_key->rbegin, mtbdd_refs_key->rcur-mtbdd_refs_key->rbegin);
    CALL(mtbdd_refs_mark_s_par, mtbdd_refs_key->sbegin, mtbdd_refs_key->scur-mtbdd_refs_key->sbegin);
    SYNC(mtbdd_refs_mark_r_par);
    SYNC(mtbdd_refs_mark_p_par);
}